

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O3

char * __thiscall
flatbuffers::JsonPrinter::PrintContainer<flatbuffers::Vector<long,unsigned_int>,unsigned_int>
          (JsonPrinter *this,uint *param_2,uint param_3,Type *param_4,int param_5)

{
  int iVar1;
  IDLOptions *pIVar2;
  uint *puVar3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  uint *puVar7;
  
  iVar1 = this->opts->indent_step;
  iVar5 = 0;
  if (0 < iVar1) {
    iVar5 = iVar1;
  }
  std::__cxx11::string::push_back((char)this->text);
  if (-1 < this->opts->indent_step) {
    std::__cxx11::string::push_back((char)this->text);
  }
  if (param_3 != 0) {
    uVar6 = 0;
    puVar7 = param_2 + 1;
    do {
      cVar4 = (char)(iVar5 + param_5);
      if (uVar6 == 0) {
        std::__cxx11::string::_M_replace_aux((ulong)this->text,this->text->_M_string_length,0,cVar4)
        ;
        puVar3 = param_2 + 1;
        if (*param_2 == 0) goto LAB_00145a4d;
      }
      else {
        pIVar2 = this->opts;
        if (pIVar2->protobuf_ascii_alike == false) {
          std::__cxx11::string::push_back((char)this->text);
          pIVar2 = this->opts;
        }
        if (-1 < pIVar2->indent_step) {
          std::__cxx11::string::push_back((char)this->text);
        }
        std::__cxx11::string::_M_replace_aux((ulong)this->text,this->text->_M_string_length,0,cVar4)
        ;
        puVar3 = puVar7;
        if (*param_2 <= uVar6) {
LAB_00145a4d:
          __assert_fail("i < size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                        ,0xc1,
                        "return_type flatbuffers::Vector<long>::Get(SizeT) const [T = long, SizeT = unsigned int]"
                       );
        }
      }
      PrintScalar<long>(this,*(long *)puVar3,param_4,iVar5 + param_5);
      uVar6 = uVar6 + 1;
      puVar7 = puVar7 + 2;
    } while (param_3 != uVar6);
  }
  if (-1 < this->opts->indent_step) {
    std::__cxx11::string::push_back((char)this->text);
  }
  std::__cxx11::string::_M_replace_aux
            ((ulong)this->text,this->text->_M_string_length,0,(char)param_5);
  std::__cxx11::string::push_back((char)this->text);
  return (char *)0x0;
}

Assistant:

const char *PrintContainer(PrintScalarTag, const Container &c, SizeT size,
                             const Type &type, int indent, const uint8_t *) {
    const auto elem_indent = indent + Indent();
    text += '[';
    AddNewLine();
    for (SizeT i = 0; i < size; i++) {
      if (i) {
        AddComma();
        AddNewLine();
      }
      AddIndent(elem_indent);
      PrintScalar(c[i], type, elem_indent);
    }
    AddNewLine();
    AddIndent(indent);
    text += ']';
    return nullptr;
  }